

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.cpp
# Opt level: O1

void __thiscall llbuild::buildsystem::BuildValue::dump(BuildValue *this,raw_ostream *os)

{
  char *pcVar1;
  bool bVar2;
  raw_ostream *prVar3;
  FileInfo *this_00;
  size_t sVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *extraout_RDX_01;
  void *__buf_00;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  StringRef Str_07;
  StringRef Str_08;
  StringRef Str_09;
  StringRef Str_10;
  StringRef Str_11;
  StringRef Str_12;
  StringRef Str_13;
  StringRef Str_14;
  StringRef Str_15;
  StringRef SVar8;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> values;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_48;
  
  SVar8.Length = 0xb;
  SVar8.Data = "BuildValue(";
  prVar3 = llvm::raw_ostream::operator<<(os,SVar8);
  SVar8 = stringForKind(this->kind);
  llvm::raw_ostream::operator<<(prVar3,SVar8);
  if ((this->kind < (FilteredDirectoryContents|ExistingInput)) &&
     ((0x20060U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    Str.Length = 0xc;
    Str.Data = ", signature=";
    prVar3 = llvm::raw_ostream::operator<<(os,Str);
    llvm::raw_ostream::operator<<(prVar3,(this->signature).value);
  }
  if ((this->kind < (FilteredDirectoryContents|ExistingInput)) &&
     ((0x20414U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    Str_00.Length = 0xf;
    Str_00.Data = ", outputInfos=[";
    llvm::raw_ostream::operator<<(os,Str_00);
    uVar5 = 0;
    while( true ) {
      if ((SuccessfulCommandWithOutputSignature < this->kind) ||
         ((0x20414U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) == 0)) {
        __assert_fail("kindHasOutputInfo() && \"invalid call for value kind\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                      ,0x186,"unsigned int llbuild::buildsystem::BuildValue::getNumOutputs() const")
        ;
      }
      if (uVar5 == this->numOutputInfos) break;
      this_00 = getNthOutputInfo(this,uVar5);
      if (uVar5 != 0) {
        Str_01.Length = 2;
        Str_01.Data = ", ";
        llvm::raw_ostream::operator<<(os,Str_01);
      }
      bVar2 = llbuild::basic::FileInfo::isMissing(this_00);
      if (bVar2) {
        sVar4 = 0x15;
        pcVar6 = "FileInfo{/*missing*/}";
        prVar3 = os;
      }
      else {
        Str_02.Length = 9;
        Str_02.Data = "FileInfo{";
        prVar3 = llvm::raw_ostream::operator<<(os,Str_02);
        Str_03.Length = 4;
        Str_03.Data = "dev=";
        prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_03);
        prVar3 = llvm::raw_ostream::operator<<(prVar3,this_00->device);
        Str_04.Length = 8;
        Str_04.Data = ", inode=";
        prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_04);
        prVar3 = llvm::raw_ostream::operator<<(prVar3,this_00->inode);
        Str_05.Length = 7;
        Str_05.Data = ", mode=";
        prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_05);
        prVar3 = llvm::raw_ostream::operator<<(prVar3,this_00->mode);
        Str_06.Length = 7;
        Str_06.Data = ", size=";
        prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_06);
        prVar3 = llvm::raw_ostream::operator<<(prVar3,this_00->size);
        Str_07.Length = 0xb;
        Str_07.Data = ", modTime=(";
        prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_07);
        prVar3 = llvm::raw_ostream::operator<<(prVar3,(this_00->modTime).seconds);
        Str_08.Length = 1;
        Str_08.Data = ":";
        prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_08);
        prVar3 = llvm::raw_ostream::operator<<(prVar3,(this_00->modTime).nanoseconds);
        sVar4 = 1;
        pcVar6 = "}";
      }
      Str_09.Length = sVar4;
      Str_09.Data = pcVar6;
      llvm::raw_ostream::operator<<(prVar3,Str_09);
      uVar5 = uVar5 + 1;
    }
    Str_10.Length = 1;
    Str_10.Data = "]";
    llvm::raw_ostream::operator<<(os,Str_10);
  }
  if ((this->kind < SuccessfulCommandWithOutputSignature) &&
     (pcVar6 = (char *)0x10090,
     (0x10090U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    getStringListValues(&local_48,this);
    Str_11.Length = 10;
    Str_11.Data = ", values=[";
    llvm::raw_ostream::operator<<(os,Str_11);
    if (local_48.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_48.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar5 = 1;
      uVar7 = 0;
      __buf_00 = extraout_RDX;
      do {
        if (uVar5 != 1) {
          Str_12.Length = 2;
          Str_12.Data = ", ";
          llvm::raw_ostream::operator<<(os,Str_12);
          __buf_00 = extraout_RDX_00;
        }
        pcVar1 = os->OutBufCur;
        if (pcVar1 < os->OutBufEnd) {
          os->OutBufCur = pcVar1 + 1;
          *pcVar1 = '\"';
        }
        else {
          llvm::raw_ostream::write(os,0x22,__buf_00,(size_t)pcVar6);
        }
        pcVar6 = (char *)0x0;
        Str_13.Length =
             local_48.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7].Length;
        Str_13.Data = local_48.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar7].Data;
        llvm::raw_ostream::write_escaped(os,Str_13,false);
        pcVar1 = os->OutBufCur;
        if (pcVar1 < os->OutBufEnd) {
          pcVar6 = pcVar1 + 1;
          os->OutBufCur = pcVar6;
          *pcVar1 = '\"';
          __buf_00 = __buf;
        }
        else {
          llvm::raw_ostream::write(os,0x22,__buf,(size_t)pcVar6);
          __buf_00 = extraout_RDX_01;
        }
        uVar7 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
      } while ((long)local_48.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_48.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4 != uVar7);
    }
    Str_14.Length = 1;
    Str_14.Data = "]";
    llvm::raw_ostream::operator<<(os,Str_14);
    if (local_48.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  Str_15.Length = 1;
  Str_15.Data = ")";
  llvm::raw_ostream::operator<<(os,Str_15);
  return;
}

Assistant:

void BuildValue::dump(raw_ostream& os) const {
  os << "BuildValue(" << stringForKind(kind);
  if (kindHasSignature()) {
    os << ", signature=" << signature.value;
  }
  if (kindHasOutputInfo()) {
    os << ", outputInfos=[";
    for (unsigned i = 0; i != getNumOutputs(); ++i) {
      auto& info = getNthOutputInfo(i);
      if (i != 0) os << ", ";
      if (info.isMissing()) {
        os << "FileInfo{/*missing*/}";
      } else {
        os << "FileInfo{"
           << "dev=" << info.device
           << ", inode=" << info.inode
           << ", mode=" << info.mode
           << ", size=" << info.size
           << ", modTime=(" << info.modTime.seconds
           << ":" << info.modTime.nanoseconds << "}";
      }
    }
    os << "]";
  }
  if (kindHasStringList()) {
    std::vector<StringRef> values = getStringListValues();
    os << ", values=[";
    for (unsigned i = 0; i != values.size(); ++i) {
      if (i != 0) os << ", ";
      os << '"';
      os.write_escaped(values[i]);
      os << '"';
    }
    os << "]";
  }
  os << ")";
}